

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Arc2D(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement_Geometry2D *pCVar7;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  undefined1 local_a0 [8];
  string an;
  uint local_6c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  float local_58;
  float startAngle;
  float radius;
  float endAngle;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&radius);
  startAngle = 1.5707964;
  local_58 = 1.0;
  ne._4_4_ = 0.0;
  _idx_end = (CX3DImporter_NodeElement_Geometry2D *)0x0;
  local_6c = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_6c < iVar2; local_6c = local_6c + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_6c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar3),
               (allocator *)
               ((long)&tlist.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tlist.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_6c);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl._M_node
      ._M_size._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_6c);
        std::__cxx11::string::operator=((string *)&radius,(char *)CONCAT44(extraout_var_01,iVar3));
        tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"bboxCenter");
        if (bVar1) {
          tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          _M_node._M_size._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"bboxSize");
          if (bVar1) {
            tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            _M_node._M_size._0_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"containerField");
            if (bVar1) {
              tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
              ._M_node._M_size._0_4_ = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,"endAngle");
              if (bVar1) {
                startAngle = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size._0_4_ = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"radius");
                if (bVar1) {
                  local_58 = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                  tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node._M_size._0_4_ = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_a0,"startAngle");
                  if (bVar1) {
                    ne._4_4_ = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                    tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl._M_node._M_size._0_4_ = 4;
                  }
                  else {
                    Throw_IncorrectAttr(this,(string *)local_a0);
                    tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl._M_node._M_size._0_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&radius,ENET_Arc2D,(CX3DImporter_NodeElement **)&idx_end)
    ;
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&radius);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar7 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
              (pCVar7,ENET_Arc2D,this->NodeElement_Cur);
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c0);
    GeometryHelper_Make_Arc2D
              (this,ne._4_4_,startAngle,local_58,10,
               (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c0);
    GeometryHelper_Extend_PointToLine
              (this,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c0,
               &_idx_end->Vertices);
    _idx_end->NumIndices = 2;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"Arc2D",&local_e1);
      ParseNode_Metadata(this,&pCVar7->super_CX3DImporter_NodeElement,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c0);
  }
  std::__cxx11::string::~string((string *)&radius);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Arc2D()
{
    std::string def, use;
    float endAngle = AI_MATH_HALF_PI_F;
    float radius = 1;
    float startAngle = 0;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("endAngle", endAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("startAngle", startAngle, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Arc2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Arc2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// create point list of geometry object and convert it to line set.
		std::list<aiVector3D> tlist;

		GeometryHelper_Make_Arc2D(startAngle, endAngle, radius, 10, tlist);///TODO: IME - AI_CONFIG for NumSeg
		GeometryHelper_Extend_PointToLine(tlist, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Arc2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}